

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

int tcmalloc_backtrace_uncompress_zstd
              (backtrace_state *state,uchar *compressed,size_t compressed_size,
              backtrace_error_callback error_callback,void *data,uchar *uncompressed,
              size_t uncompressed_size)

{
  int iVar1;
  uchar *zdebug_table;
  
  zdebug_table = (uchar *)tcmalloc_backtrace_alloc(state,0x4000,error_callback,data);
  if (zdebug_table == (uchar *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = elf_zstd_decompress(compressed,compressed_size,zdebug_table,uncompressed,
                                uncompressed_size);
    tcmalloc_backtrace_free(state,zdebug_table,0x4000,error_callback,data);
  }
  return iVar1;
}

Assistant:

int
backtrace_uncompress_zstd (struct backtrace_state *state,
			   const unsigned char *compressed,
			   size_t compressed_size,
			   backtrace_error_callback error_callback,
			   void *data, unsigned char *uncompressed,
			   size_t uncompressed_size)
{
  unsigned char *zdebug_table;
  int ret;

  zdebug_table = ((unsigned char *) backtrace_alloc (state, ZDEBUG_TABLE_SIZE,
						     error_callback, data));
  if (zdebug_table == NULL)
    return 0;
  ret = elf_zstd_decompress (compressed, compressed_size,
			     zdebug_table, uncompressed, uncompressed_size);
  backtrace_free (state, zdebug_table, ZDEBUG_TABLE_SIZE,
		  error_callback, data);
  return ret;
}